

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this,
          byte *param_2)

{
  byte bVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar2;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar3;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar4;
  undefined8 uVar5;
  
  bVar1 = *param_2;
  bVar2 = *(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)(param_2 + 1);
  uVar5 = *(undefined8 *)(param_2 + 8);
  bVar3 = *this;
  *param_2 = bVar1 & 0xf0 | (byte)bVar3 & 0xf;
  bVar4 = *this;
  *param_2 = (byte)bVar4 & 0xf0 | (byte)bVar3 & 0xf;
  *(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)(param_2 + 1) =
       this[1];
  memcpy(param_2 + 2,this + 2,(ulong)((byte)*this >> 4));
  param_2[(ulong)((byte)bVar4 >> 4) + 2] = 0;
  *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)(bVar1 & 0xf);
  this[1] = bVar2;
  *(undefined8 *)(this + 8) = uVar5;
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }